

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

void Ssc_GiaSavePiPattern(Gia_Man_t *p,Vec_Int_t *vPat)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int nObjs;
  Vec_Wrd_t *p_00;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  word *pwVar7;
  long lVar8;
  
  nObjs = vPat->nSize;
  pVVar4 = p->vCis;
  if (nObjs != pVVar4->nSize) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0x99,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar6 = p->iPatsPi;
  p_00 = p->vSimsPi;
  iVar3 = p_00->nSize;
  iVar5 = p->nRegs;
  iVar2 = (iVar3 / (nObjs - iVar5)) * 0x40;
  if (iVar6 == iVar2) {
    Vec_WrdDoubleSimInfo(p_00,nObjs);
    iVar6 = p->iPatsPi;
    p_00 = p->vSimsPi;
    iVar3 = p_00->nSize;
    iVar5 = p->nRegs;
    pVVar4 = p->vCis;
    nObjs = pVVar4->nSize;
    iVar2 = iVar3 / (nObjs - iVar5) << 6;
  }
  if (iVar6 < iVar2) {
    if (iVar3 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    if (0 < nObjs) {
      pwVar7 = p_00->pArray;
      lVar8 = 0;
      do {
        if (vPat->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (vPat->pArray[lVar8] != 0) {
          puVar1 = (uint *)((long)pwVar7 + (long)(p->iPatsPi >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)p->iPatsPi & 0x1f);
          iVar3 = p_00->nSize;
          iVar5 = p->nRegs;
          nObjs = pVVar4->nSize;
        }
        lVar8 = lVar8 + 1;
        pwVar7 = pwVar7 + iVar3 / (nObjs - iVar5);
      } while (lVar8 < nObjs);
      iVar6 = p->iPatsPi;
    }
    p->iPatsPi = iVar6 + 1;
    return;
  }
  __assert_fail("p->iPatsPi < 64 * Gia_ObjSimWords(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                ,0x9c,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Ssc_GiaSavePiPattern( Gia_Man_t * p, Vec_Int_t * vPat )
{
    word * pSimPi;
    int i;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    if ( p->iPatsPi == 64 * Gia_ObjSimWords(p) )
        Vec_WrdDoubleSimInfo( p->vSimsPi, Gia_ManCiNum(p) );
    assert( p->iPatsPi < 64 * Gia_ObjSimWords(p) );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++, pSimPi += Gia_ObjSimWords(p) )
        if ( Vec_IntEntry(vPat, i) )
            Abc_InfoSetBit( (unsigned *)pSimPi, p->iPatsPi );
    p->iPatsPi++;
}